

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O0

void hufFreeDecTable(exr_const_context_t pctxt,HufDec *hdecod)

{
  long in_RSI;
  long in_RDI;
  int i;
  _func_void_void_ptr *free_fn;
  code *local_28;
  int local_1c;
  
  if (in_RDI == 0) {
    local_28 = internal_exr_free;
  }
  else {
    local_28 = *(code **)(in_RDI + 0x60);
  }
  for (local_1c = 0; local_1c < 0x4000; local_1c = local_1c + 1) {
    if (*(long *)(in_RSI + (long)local_1c * 0x10 + 8) != 0) {
      (*local_28)(*(undefined8 *)(in_RSI + (long)local_1c * 0x10 + 8));
      *(undefined8 *)(in_RSI + (long)local_1c * 0x10 + 8) = 0;
    }
  }
  return;
}

Assistant:

static void
hufFreeDecTable (exr_const_context_t pctxt, HufDec* hdecod)
{
    void (*free_fn) (void*) = pctxt ? pctxt->free_fn : internal_exr_free;
    for (int i = 0; i < HUF_DECSIZE; i++)
    {
        if (hdecod[i].p)
        {
            free_fn (hdecod[i].p);
            hdecod[i].p = NULL;
        }
    }
}